

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

_Bool oonf_layer2_neigh_commit(oonf_layer2_neigh *l2neigh)

{
  long lVar1;
  _Bool _Var2;
  
  if (((l2neigh->destinations).count == 0) && ((l2neigh->remote_neighbor_ips).count == 0)) {
    lVar1 = 0xd0;
    do {
      if ((*(long *)((l2neigh->key).addr._addr + lVar1) != 0) &&
         (*(long *)((l2neigh->key).addr._addr + lVar1 + -8) != 0)) goto LAB_0010d05c;
      lVar1 = lVar1 + 0x28;
    } while (lVar1 != 0x4e0);
    _neigh_remove(l2neigh);
    _Var2 = true;
  }
  else {
LAB_0010d05c:
    _Var2 = false;
    oonf_class_event(&_l2neighbor_class,l2neigh,OONF_OBJECT_CHANGED);
    l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
  }
  return _Var2;
}

Assistant:

bool
oonf_layer2_neigh_commit(struct oonf_layer2_neigh *l2neigh) {
  size_t i;

  if (l2neigh->destinations.count > 0 || l2neigh->remote_neighbor_ips.count > 0) {
    oonf_class_event(&_l2neighbor_class, l2neigh, OONF_OBJECT_CHANGED);
    l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
    return false;
  }

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_has_value(&l2neigh->data[i])) {
      oonf_class_event(&_l2neighbor_class, l2neigh, OONF_OBJECT_CHANGED);
      l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
      return false;
    }
  }

  _neigh_remove(l2neigh);
  return true;
}